

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  ImFontAtlas *this;
  ImTextureID texture_id;
  bool bVar1;
  float fVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float in_XMM1_Db;
  ImVec2 uv [4];
  ImVec2 local_d8;
  ImU32 local_d0;
  ImU32 local_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (mouse_cursor != -1) {
    fStack_c0 = (float)in_XMM0_Dc;
    local_c8 = (undefined1  [8])pos;
    fStack_bc = (float)in_XMM0_Dd;
    local_68 = scale;
    if (7 < (uint)mouse_cursor) {
      __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                    ,0xbe5,
                    "void ImGui::RenderMouseCursor(ImDrawList *, ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                   );
    }
    this = draw_list->_Data->Font->ContainerAtlas;
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_a0.x = 0.0;
    local_a0.y = 0.0;
    local_78.x = 0.0;
    local_78.y = 0.0;
    IStack_70.x = 0.0;
    IStack_70.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    IStack_80.x = 0.0;
    IStack_80.y = 0.0;
    fStack_64 = in_XMM1_Db;
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&local_98,&local_a0,&local_88,&local_78);
    if (bVar1) {
      local_c8._0_4_ = (float)local_c8._0_4_ - local_98.x;
      local_c8._4_4_ = (float)local_c8._4_4_ - local_98.y;
      fStack_c0 = fStack_c0 - 0.0;
      fStack_bc = fStack_bc - 0.0;
      local_90.y = (float)local_c8._4_4_;
      local_90.x = (float)local_c8._0_4_;
      texture_id = this->TexID;
      ImDrawList::PushTextureID(draw_list,texture_id);
      local_58 = local_68 + (float)local_c8._0_4_;
      fStack_54 = local_68 * 0.0 + (float)local_c8._4_4_;
      fStack_50 = fStack_64 + fStack_c0;
      fStack_4c = fStack_bc + 0.0;
      local_d8.y = fStack_54;
      local_d8.x = local_58;
      local_b8 = local_68 * local_a0.x;
      fStack_b4 = local_68 * local_a0.y;
      fStack_b0 = local_68 * 0.0;
      fStack_ac = local_68 * 0.0;
      local_48 = local_58 + local_b8;
      fStack_44 = fStack_54 + fStack_b4;
      fStack_40 = fStack_50 + fStack_b0;
      fStack_3c = fStack_4c + fStack_ac;
      local_a8.y = fStack_44;
      local_a8.x = local_48;
      local_d0 = col_border;
      local_cc = col_fill;
      ImDrawList::AddImage(draw_list,texture_id,&local_d8,&local_a8,&local_78,&IStack_70,col_shadow)
      ;
      fVar2 = local_68 + local_68 + (float)local_c8._0_4_;
      local_d8.y = fStack_54;
      local_d8.x = fVar2;
      local_a8.y = fStack_44;
      local_a8.x = fVar2 + local_b8;
      ImDrawList::AddImage(draw_list,texture_id,&local_d8,&local_a8,&local_78,&IStack_70,col_shadow)
      ;
      local_b8 = local_b8 + (float)local_c8._0_4_;
      fStack_b4 = fStack_b4 + (float)local_c8._4_4_;
      fStack_b0 = fStack_b0 + fStack_c0;
      fStack_ac = fStack_ac + fStack_bc;
      local_d8.y = fStack_b4;
      local_d8.x = local_b8;
      ImDrawList::AddImage(draw_list,texture_id,&local_90,&local_d8,&local_78,&IStack_70,local_d0);
      local_d8.y = fStack_b4;
      local_d8.x = local_b8;
      ImDrawList::AddImage(draw_list,texture_id,&local_90,&local_d8,&local_88,&IStack_80,local_cc);
      ImDrawList::PopTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}